

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

bool __thiscall
ImplicitDepLoader::LoadDepFile(ImplicitDepLoader *this,Edge *edge,string *path,string *err)

{
  size_t *len;
  Node *pNVar1;
  size_t __n;
  pointer pcVar2;
  Metrics *this_00;
  bool bVar3;
  int iVar4;
  long *plVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var6;
  undefined8 *puVar7;
  Metric *pMVar8;
  ulong *puVar9;
  undefined1 uVar10;
  Node **ppNVar11;
  _Alloc_hider _Var12;
  undefined8 uVar13;
  ulong uVar14;
  StringPiece *pSVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string depfile_err;
  DepfileParser depfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string content;
  ScopedMetric metrics_h_scoped;
  uint64_t unused;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  undefined8 local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  string local_100;
  undefined1 local_e0 [24];
  undefined8 auStack_c8 [2];
  pointer local_b8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  long local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  ScopedMetric local_48;
  uint64_t local_38;
  
  if ((LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar8 = (Metric *)0x0;
    }
    else {
      local_e0._0_8_ = (StringPiece *)(local_e0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"depfile load","");
      pMVar8 = Metrics::NewMetric(this_00,(string *)local_e0);
      if ((StringPiece *)local_e0._0_8_ != (StringPiece *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
      }
    }
    LoadDepFile::metrics_h_metric = pMVar8;
    __cxa_guard_release(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_48,LoadDepFile::metrics_h_metric);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  iVar4 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[2])
                    (this->disk_interface_,path,&local_68,err);
  if (iVar4 == 1) {
    err->_M_string_length = 0;
    *(err->_M_dataplus)._M_p = '\0';
LAB_0019dd0d:
    if (local_68._M_string_length != 0) {
      DepfileParser::DepfileParser((DepfileParser *)local_e0);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_allocated_capacity =
           local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar3 = DepfileParser::Parse((DepfileParser *)local_e0,&local_68,&local_100);
      uVar13 = local_e0._0_8_;
      if (bVar3) {
        if (local_e0._0_8_ == local_e0._8_8_) {
          pcVar2 = (path->_M_dataplus)._M_p;
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,pcVar2,pcVar2 + path->_M_string_length);
          std::__cxx11::string::append((char *)&local_140);
          std::__cxx11::string::operator=((string *)err,(string *)&local_140);
          local_78._M_allocated_capacity = local_140.field_2._M_allocated_capacity;
          _Var12._M_p = local_140._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) goto LAB_0019dfdc;
          goto LAB_0019dfe4;
        }
        len = (size_t *)(local_e0._0_8_ + 8);
        CanonicalizePath(*(char **)local_e0._0_8_,len,&local_38);
        pNVar1 = *(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __n = (pNVar1->path_)._M_string_length;
        if ((__n == *len) &&
           (iVar4 = bcmp((pNVar1->path_)._M_dataplus._M_p,*(void **)uVar13,__n), iVar4 == 0)) {
          if (local_e0._0_8_ != local_e0._8_8_) {
            ppNVar11 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            pSVar15 = (StringPiece *)local_e0._0_8_;
            do {
              _Var6 = std::
                      __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_pred<matches>>
                                ((edge->outputs_).
                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                 super__Vector_impl_data._M_start,ppNVar11,pSVar15);
              ppNVar11 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              if (_Var6._M_current == ppNVar11) {
                pcVar2 = (path->_M_dataplus)._M_p;
                local_88 = &local_78;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_88,pcVar2,pcVar2 + path->_M_string_length);
                std::__cxx11::string::append((char *)&local_88);
                local_a8 = &local_98;
                if (pSVar15->len_ == 0) {
                  local_a0 = 0;
                  local_98 = 0;
                }
                else {
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_a8,pSVar15->str_,pSVar15->str_ + pSVar15->len_);
                }
                uVar13 = 0xf;
                if (local_88 != &local_78) {
                  uVar13 = local_78._M_allocated_capacity;
                }
                if ((ulong)uVar13 < (ulong)(local_a0 + local_80)) {
                  uVar14 = 0xf;
                  if (local_a8 != &local_98) {
                    uVar14 = CONCAT71(uStack_97,local_98);
                  }
                  if (uVar14 < (ulong)(local_a0 + local_80)) goto LAB_0019e1ce;
                  puVar7 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_a8,0,(char *)0x0,(ulong)local_88);
                }
                else {
LAB_0019e1ce:
                  puVar7 = (undefined8 *)
                           std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8);
                }
                local_120 = &local_110;
                puVar9 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar9) {
                  local_110._M_allocated_capacity = *puVar9;
                  local_110._8_8_ = puVar7[3];
                }
                else {
                  local_110._M_allocated_capacity = *puVar9;
                  local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*puVar7;
                }
                local_118 = puVar7[1];
                *puVar7 = puVar9;
                puVar7[1] = 0;
                *(undefined1 *)puVar9 = 0;
                puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
                puVar9 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar9) {
                  local_140.field_2._M_allocated_capacity = *puVar9;
                  local_140.field_2._8_8_ = puVar7[3];
                  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                }
                else {
                  local_140.field_2._M_allocated_capacity = *puVar9;
                  local_140._M_dataplus._M_p = (pointer)*puVar7;
                }
                local_140._M_string_length = puVar7[1];
                *puVar7 = puVar9;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                std::__cxx11::string::operator=((string *)err,(string *)&local_140);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) {
                  operator_delete(local_140._M_dataplus._M_p,
                                  local_140.field_2._M_allocated_capacity + 1);
                }
                if (local_120 != &local_110) {
                  operator_delete(local_120,local_110._M_allocated_capacity + 1);
                }
                if (local_a8 != &local_98) {
                  operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
                }
                _Var12._M_p = (pointer)local_88;
                if (local_88 != &local_78) goto LAB_0019dfdc;
                goto LAB_0019dfe4;
              }
              pSVar15 = pSVar15 + 1;
            } while (pSVar15 != (StringPiece *)local_e0._8_8_);
          }
          iVar4 = (**this->_vptr_ImplicitDepLoader)(this,edge,auStack_c8,err);
          uVar10 = (undefined1)iVar4;
        }
        else {
          if (g_explaining == true) {
            StringPiece::AsString_abi_cxx11_(&local_140,(StringPiece *)uVar13);
            LoadDepFile();
          }
          uVar10 = 0;
        }
      }
      else {
        pcVar2 = (path->_M_dataplus)._M_p;
        local_120 = &local_110;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,pcVar2,pcVar2 + path->_M_string_length);
        std::__cxx11::string::append((char *)&local_120);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_120,(ulong)local_100._M_dataplus._M_p);
        puVar9 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_140.field_2._M_allocated_capacity = *puVar9;
          local_140.field_2._8_8_ = puVar7[3];
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        }
        else {
          local_140.field_2._M_allocated_capacity = *puVar9;
          local_140._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_140._M_string_length = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)err,(string *)&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        local_78._M_allocated_capacity = local_110._M_allocated_capacity;
        _Var12._M_p = (pointer)local_120;
        if (local_120 != &local_110) {
LAB_0019dfdc:
          operator_delete(_Var12._M_p,local_78._M_allocated_capacity + 1);
        }
LAB_0019dfe4:
        uVar10 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)auStack_c8[0] != (pointer)0x0) {
        operator_delete((void *)auStack_c8[0],(long)local_b8 - auStack_c8[0]);
      }
      if ((StringPiece *)local_e0._0_8_ != (StringPiece *)0x0) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ - local_e0._0_8_);
      }
      goto LAB_0019e031;
    }
    if (g_explaining == true) {
      LoadDepFile((ImplicitDepLoader *)path);
    }
  }
  else {
    if (iVar4 != 2) goto LAB_0019dd0d;
    std::operator+(&local_140,"loading \'",path);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_100.field_2._M_allocated_capacity = *puVar9;
      local_100.field_2._8_8_ = plVar5[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *puVar9;
      local_100._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_100._M_string_length = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,(ulong)(err->_M_dataplus)._M_p);
    pSVar15 = (StringPiece *)(plVar5 + 2);
    if ((StringPiece *)*plVar5 == pSVar15) {
      local_e0._16_8_ = pSVar15->str_;
      auStack_c8[0] = plVar5[3];
      local_e0._0_8_ = (StringPiece *)(local_e0 + 0x10);
    }
    else {
      local_e0._16_8_ = pSVar15->str_;
      local_e0._0_8_ = (StringPiece *)*plVar5;
    }
    local_e0._8_8_ = plVar5[1];
    *plVar5 = (long)pSVar15;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)local_e0);
    if ((StringPiece *)local_e0._0_8_ != (StringPiece *)(local_e0 + 0x10)) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  uVar10 = 0;
LAB_0019e031:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  ScopedMetric::~ScopedMetric(&local_48);
  return (bool)uVar10;
}

Assistant:

bool ImplicitDepLoader::LoadDepFile(Edge* edge, const string& path,
                                    string* err) {
  METRIC_RECORD("depfile load");
  // Read depfile content.  Treat a missing depfile as empty.
  string content;
  switch (disk_interface_->ReadFile(path, &content, err)) {
  case DiskInterface::Okay:
    break;
  case DiskInterface::NotFound:
    err->clear();
    break;
  case DiskInterface::OtherError:
    *err = "loading '" + path + "': " + *err;
    return false;
  }
  // On a missing depfile: return false and empty *err.
  if (content.empty()) {
    EXPLAIN("depfile '%s' is missing", path.c_str());
    return false;
  }

  DepfileParser depfile(depfile_parser_options_
                        ? *depfile_parser_options_
                        : DepfileParserOptions());
  string depfile_err;
  if (!depfile.Parse(&content, &depfile_err)) {
    *err = path + ": " + depfile_err;
    return false;
  }

  if (depfile.outs_.empty()) {
    *err = path + ": no outputs declared";
    return false;
  }

  uint64_t unused;
  std::vector<StringPiece>::iterator primary_out = depfile.outs_.begin();
  CanonicalizePath(const_cast<char*>(primary_out->str_), &primary_out->len_,
                   &unused);

  // Check that this depfile matches the edge's output, if not return false to
  // mark the edge as dirty.
  Node* first_output = edge->outputs_[0];
  StringPiece opath = StringPiece(first_output->path());
  if (opath != *primary_out) {
    EXPLAIN("expected depfile '%s' to mention '%s', got '%s'", path.c_str(),
            first_output->path().c_str(), primary_out->AsString().c_str());
    return false;
  }

  // Ensure that all mentioned outputs are outputs of the edge.
  for (std::vector<StringPiece>::iterator o = depfile.outs_.begin();
       o != depfile.outs_.end(); ++o) {
    matches m(o);
    if (std::find_if(edge->outputs_.begin(), edge->outputs_.end(), m) == edge->outputs_.end()) {
      *err = path + ": depfile mentions '" + o->AsString() + "' as an output, but no such output was declared";
      return false;
    }
  }

  return ProcessDepfileDeps(edge, &depfile.ins_, err);
}